

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O3

void __thiscall
gvr::PointCloud::PointCloud
          (PointCloud *this,PointCloud *p,vector<bool,_std::allocator<bool>_> *vused)

{
  uint uVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  
  (this->super_Model).origin.v[0] = 0.0;
  (this->super_Model).origin.v[1] = 0.0;
  (this->super_Model).origin.v[2] = 0.0;
  (this->super_Model).Rc.v[1][0] = 0.0;
  (this->super_Model).Rc.v[1][1] = 0.0;
  (this->super_Model).Rc.v[0][1] = 0.0;
  (this->super_Model).Rc.v[0][2] = 0.0;
  (this->super_Model).Rc.v[1][2] = 0.0;
  (this->super_Model).Rc.v[2][0] = 0.0;
  (this->super_Model).Rc.v[2][1] = 0.0;
  (this->super_Model).Rc.v[0][0] = 1.0;
  (this->super_Model).Rc.v[1][1] = 1.0;
  (this->super_Model).Rc.v[2][2] = 1.0;
  (this->super_Model).Tc.v[0] = 0.0;
  (this->super_Model).Tc.v[1] = 0.0;
  (this->super_Model).Tc.v[2] = 0.0;
  (this->super_Model).id = (p->super_Model).id;
  lVar2 = 2;
  do {
    (this->super_Model).origin.v[lVar2 + -2] = (p->super_Model).origin.v[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__PointCloud_001770c0;
  this->n = 0;
  this->vertex = (float *)0x0;
  this->scanprop = (float *)0x0;
  this->scanpos = (float *)0x0;
  lVar2 = *(long *)vused;
  uVar9 = 0;
  uVar6 = uVar9;
  if (0 < *(int *)(vused + 0x18) + ((int)*(undefined8 *)(vused + 0x10) - (int)lVar2) * 8) {
    uVar1 = *(int *)(vused + 0x18) + (int)*(undefined8 *)(vused + 0x10) * 8 + (int)lVar2 * -8 + 1;
    do {
      if ((*(ulong *)(lVar2 + (ulong)(uVar1 - 2 >> 6) * 8) >> ((ulong)(uVar1 - 2) & 0x3f) & 1) != 0)
      {
        uVar10 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar10;
        this->n = uVar10;
      }
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)uVar9) {
      uVar6 = (long)((int)uVar9 * 3) << 2;
    }
  }
  pfVar3 = (float *)operator_new__(uVar6);
  this->vertex = pfVar3;
  iVar8 = p->n;
  uVar9 = (ulong)iVar8;
  if (0 < (long)uVar9) {
    pfVar4 = p->vertex + 2;
    uVar5 = 0;
    iVar7 = 0;
    do {
      if ((*(ulong *)(lVar2 + (uVar5 >> 6 & 0x3ffffff) * 8) >> (uVar5 & 0x3f) & 1) != 0) {
        pfVar3[iVar7] = pfVar4[-2];
        pfVar3[(long)iVar7 + 1] = pfVar4[-1];
        pfVar3[(long)iVar7 + 2] = *pfVar4;
        iVar7 = iVar7 + 3;
      }
      uVar5 = uVar5 + 1;
      pfVar4 = pfVar4 + 3;
    } while (uVar9 != uVar5);
  }
  if (p->scanprop != (float *)0x0) {
    pfVar3 = (float *)operator_new__(uVar6);
    this->scanprop = pfVar3;
    if (0 < iVar8) {
      pfVar4 = p->scanprop + 2;
      uVar5 = 0;
      iVar7 = 0;
      do {
        if ((*(ulong *)(lVar2 + (uVar5 >> 6 & 0x3ffffff) * 8) >> (uVar5 & 0x3f) & 1) != 0) {
          pfVar3[iVar7] = pfVar4[-2];
          pfVar3[(long)iVar7 + 1] = pfVar4[-1];
          pfVar3[(long)iVar7 + 2] = *pfVar4;
          iVar7 = iVar7 + 3;
        }
        uVar5 = uVar5 + 1;
        pfVar4 = pfVar4 + 3;
      } while (uVar9 != uVar5);
    }
  }
  if (p->scanpos != (float *)0x0) {
    pfVar3 = (float *)operator_new__(uVar6);
    this->scanpos = pfVar3;
    if (0 < iVar8) {
      pfVar4 = p->scanpos + 2;
      uVar6 = 0;
      iVar8 = 0;
      do {
        if ((*(ulong *)(lVar2 + (uVar6 >> 6 & 0x3ffffff) * 8) >> (uVar6 & 0x3f) & 1) != 0) {
          pfVar3[iVar8] = pfVar4[-2];
          pfVar3[(long)iVar8 + 1] = pfVar4[-1];
          pfVar3[(long)iVar8 + 2] = *pfVar4;
          iVar8 = iVar8 + 3;
        }
        uVar6 = uVar6 + 1;
        pfVar4 = pfVar4 + 3;
      } while (uVar9 != uVar6);
    }
  }
  return;
}

Assistant:

PointCloud::PointCloud(const PointCloud &p, const std::vector<bool> &vused) : Model(p)
{
  n=0;
  vertex=0;
  scanprop=0;
  scanpos=0;

  for (int i=static_cast<int>(vused.size())-1; i>=0; i--)
  {
    if (vused[i])
    {
      n++;
    }
  }

  vertex=new float [3*n];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      vertex[k++]=p.getVertexComp(i, 0);
      vertex[k++]=p.getVertexComp(i, 1);
      vertex[k++]=p.getVertexComp(i, 2);
    }
  }

  if (p.hasScanProp())
  {
    scanprop=new float [3*n];

    k=0;

    for (int i=0; i<p.getVertexCount(); i++)
    {
      if (vused[i])
      {
        scanprop[k++]=p.getScanSize(i);
        scanprop[k++]=p.getScanError(i);
        scanprop[k++]=p.getScanConf(i);
      }
    }
  }

  if (p.hasScanPos())
  {
    scanpos=new float [3*n];

    k=0;

    for (int i=0; i<p.getVertexCount(); i++)
    {
      if (vused[i])
      {
        scanpos[k++]=p.getScanPosComp(i, 0);
        scanpos[k++]=p.getScanPosComp(i, 1);
        scanpos[k++]=p.getScanPosComp(i, 2);
      }
    }
  }
}